

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateHashCode
          (MessageGenerator *this,Printer *printer)

{
  FieldGenerator *pFVar1;
  long lVar2;
  int i;
  long lVar3;
  
  if ((*(int *)(this->descriptor_ + 0x2c) == 0) && (this->params_->store_unknown_fields_ != true)) {
    return;
  }
  io::Printer::Print(printer,"\n@Override\npublic int hashCode() {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"int result = 17;\n");
  io::Printer::Print(printer,"result = 31 * result + getClass().getName().hashCode();\n");
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(this->descriptor_ + 0x2c); lVar3 = lVar3 + 1) {
    pFVar1 = FieldGeneratorMap::get
                       (&this->field_generators_,
                        (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar2));
    (*pFVar1->_vptr_FieldGenerator[0xb])(pFVar1,printer);
    lVar2 = lVar2 + 0xa8;
  }
  if (this->params_->store_unknown_fields_ != false) {
    io::Printer::Print(printer,
                       "result = 31 * result + \n  (unknownFieldData == null || unknownFieldData.isEmpty() ? 0 : \n  unknownFieldData.hashCode());\n"
                      );
  }
  io::Printer::Print(printer,"return result;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::GenerateHashCode(io::Printer* printer) {
  if (descriptor_->field_count() == 0 && !params_.store_unknown_fields()) {
    return;
  }

  printer->Print(
    "\n"
    "@Override\n"
    "public int hashCode() {\n");
  printer->Indent();

  printer->Print("int result = 17;\n");
  printer->Print("result = 31 * result + getClass().getName().hashCode();\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    field_generators_.get(field).GenerateHashCodeCode(printer);
  }

  if (params_.store_unknown_fields()) {
    printer->Print(
      "result = 31 * result + \n"
      "  (unknownFieldData == null || unknownFieldData.isEmpty() ? 0 : \n"
      "  unknownFieldData.hashCode());\n");
  }

  printer->Print("return result;\n");

  printer->Outdent();
  printer->Print("}\n");
}